

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O1

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,int refinement,Bounds *core,Bounds *bounds)

{
  allocator<int> local_c1;
  Bounds *local_c0;
  int local_b4;
  DynamicPoint<int,_4UL> local_b0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_70;
  
  local_b4 = 1;
  local_c0 = bounds;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_70,(long)dim,&local_b4,&local_c1);
  operator*(&local_b0,refinement,(DynamicPoint<int,_4UL> *)&local_70);
  AMRLink(this,dim,level,&local_b0,core,local_c0);
  local_b0.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_b0.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_b0.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_b0.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data,
                    local_b0.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_70.m_end = local_70.m_begin;
  if (local_70.m_dynamic_data != (pointer)0x0) {
    operator_delete(local_70.m_dynamic_data,local_70.m_dynamic_capacity << 2);
  }
  return;
}

Assistant:

AMRLink(int dim, int level, int refinement, const Bounds& core, const Bounds& bounds):
                        AMRLink(dim, level, refinement * Point::one(dim), core, bounds)     {}